

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createExpressions.cpp
# Opt level: O2

Expr * toSigned(Expr *expr,Program *program)

{
  int iVar1;
  undefined4 extraout_var;
  Expr *pEVar2;
  IntegerType *local_20;
  Expr *local_18;
  
  local_18 = expr;
  iVar1 = (*expr->_vptr_Expr[4])();
  local_20 = TypeHandler::setSigned
                       (&program->typeHandler,(IntegerType *)CONCAT44(extraout_var,iVar1));
  pEVar2 = Program::makeExpr<CastExpr,Expr*&,IntegerType*>(program,&local_18,&local_20);
  return pEVar2;
}

Assistant:

static Expr *toSigned(Expr *expr, Program& program) {
    auto IT = static_cast<IntegerType*>(expr->getType());
    auto *cast
        = program.makeExpr<CastExpr>(
            expr,
            program.typeHandler.setSigned(IT)
    );
    return cast;
}